

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O3

int testNNValidatorReshapeBad(void)

{
  RepeatedField<long> *this;
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  ModelDescription *pMVar4;
  Type *pTVar5;
  FeatureType *pFVar6;
  ArrayFeatureType *pAVar7;
  TypeUnion this_00;
  Type *this_01;
  LayerUnion this_02;
  ostream *poVar8;
  int iVar9;
  WeightParams *pWVar10;
  int iVar11;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar11 = (pAVar7->shape_).current_size_;
  if (iVar11 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar11 + 1);
    iVar11 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar11 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar11] = 1;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar4 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar4);
    local_50.description_ = pMVar4;
  }
  pTVar5 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar5->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  pFVar6 = pTVar5->type_;
  if (pFVar6 == (FeatureType *)0x0) {
    pFVar6 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar6);
    pTVar5->type_ = pFVar6;
  }
  if (pFVar6->_oneof_case_[0] == 5) {
    pAVar7 = (pFVar6->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar6);
    pFVar6->_oneof_case_[0] = 5;
    pAVar7 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar7);
    (pFVar6->Type_).multiarraytype_ = pAVar7;
  }
  iVar11 = (pAVar7->shape_).current_size_;
  if (iVar11 == (pAVar7->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar7->shape_,iVar11 + 1);
    iVar11 = (pAVar7->shape_).current_size_;
  }
  (pAVar7->shape_).current_size_ = iVar11 + 1;
  ((pAVar7->shape_).rep_)->elements[iVar11] = 1;
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this_00.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this_00.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this_00.pipelineclassifier_;
  }
  this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(this_01,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_01,"output");
  if (this_01->_oneof_case_[0] == 300) {
    this_02 = this_01->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_01);
    this_01->_oneof_case_[0] = 300;
    this_02.convolution_ = (ConvolutionLayerParams *)operator_new(0x30);
    CoreML::Specification::ReshapeLayerParams::ReshapeLayerParams(this_02.reshape_);
    (this_01->layer_).reshape_ = (ReshapeLayerParams *)this_02;
  }
  this = &(this_02.reshape_)->targetshape_;
  iVar11 = ((this_02.convolution_)->kernelsize_).current_size_;
  iVar9 = ((this_02.convolution_)->kernelsize_).total_size_;
  if (iVar11 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 1);
    iVar11 = ((this_02.convolution_)->kernelsize_).current_size_;
    iVar9 = ((this_02.convolution_)->kernelsize_).total_size_;
  }
  pWVar10 = (this_02.innerproduct_)->bias_;
  iVar3 = iVar11 + 1;
  ((this_02.convolution_)->kernelsize_).current_size_ = iVar3;
  (&pWVar10->_internal_metadata_)[iVar11].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  if (iVar3 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 2);
    iVar3 = ((this_02.convolution_)->kernelsize_).current_size_;
    iVar9 = ((this_02.convolution_)->kernelsize_).total_size_;
    pWVar10 = (this_02.innerproduct_)->bias_;
  }
  iVar11 = iVar3 + 1;
  this->current_size_ = iVar11;
  (&pWVar10->_internal_metadata_)[iVar3].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  if (iVar11 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar3 + 2);
    iVar11 = ((this_02.convolution_)->kernelsize_).current_size_;
    iVar9 = ((this_02.convolution_)->kernelsize_).total_size_;
    pWVar10 = (this_02.innerproduct_)->bias_;
  }
  iVar3 = iVar11 + 1;
  this->current_size_ = iVar3;
  (&pWVar10->_internal_metadata_)[iVar11].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  if (iVar3 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar11 + 2);
    iVar3 = ((this_02.convolution_)->kernelsize_).current_size_;
    iVar9 = ((this_02.convolution_)->kernelsize_).total_size_;
    pWVar10 = (this_02.innerproduct_)->bias_;
  }
  iVar11 = iVar3 + 1;
  this->current_size_ = iVar11;
  (&pWVar10->_internal_metadata_)[iVar3].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  if (iVar11 == iVar9) {
    google::protobuf::RepeatedField<long>::Reserve(this,iVar3 + 2);
    iVar11 = ((this_02.convolution_)->kernelsize_).current_size_;
    pWVar10 = (this_02.innerproduct_)->bias_;
  }
  ((this_02.convolution_)->kernelsize_).current_size_ = iVar11 + 1;
  (&pWVar10->_internal_metadata_)[iVar11].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  (this_02.lrn_)->_cached_size_ = 0;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar2 = CoreML::Result::good((Result *)local_78);
  if (bVar2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x3a7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar2;
}

Assistant:

int testNNValidatorReshapeBad() {

    Specification::Model m1;

    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    auto *outshape = out->mutable_type()->mutable_multiarraytype();
    outshape->add_shape(1);

    auto *nn = m1.mutable_neuralnetwork();

    Specification::NeuralNetworkLayer *reshapeLayer = nn->add_layers();
    reshapeLayer->add_input("input");
    reshapeLayer->add_output("output");
    Specification::ReshapeLayerParams *reshapeParams = reshapeLayer->mutable_reshape();

    // 5 entries here instead of 3/4
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);
    reshapeParams->add_targetshape(1);

    reshapeParams->set_mode(::CoreML::Specification::ReshapeLayerParams_ReshapeOrder::ReshapeLayerParams_ReshapeOrder_CHANNEL_FIRST);
    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;
}